

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_draw_pal.cpp
# Opt level: O2

void __thiscall
swrenderer::FillColumnAddClampPalCommand::Execute
          (FillColumnAddClampPalCommand *this,DrawerThread *thread)

{
  uint32_t uVar1;
  uint8_t *puVar2;
  uint32_t *puVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  uint uVar7;
  uint uVar8;
  byte *pbVar9;
  
  puVar2 = (this->super_PalColumnCommand)._dest;
  puVar3 = (this->super_PalColumnCommand)._destblend;
  uVar1 = (this->super_PalColumnCommand)._srccolor;
  lVar6 = (long)(this->super_PalColumnCommand)._pitch;
  iVar4 = DrawerThread::count_for_thread
                    (thread,(this->super_PalColumnCommand).super_DrawerCommand._dest_y,
                     *(int *)&(this->super_PalColumnCommand).super_DrawerCommand.field_0xc);
  if (0 < iVar4) {
    iVar5 = DrawerThread::skipped_by_thread
                      (thread,(this->super_PalColumnCommand).super_DrawerCommand._dest_y);
    pbVar9 = puVar2 + iVar5 * lVar6;
    iVar5 = thread->num_cores;
    do {
      uVar7 = puVar3[*pbVar9] + uVar1;
      uVar8 = uVar7 & 0x40100400;
      uVar7 = uVar8 - (uVar8 >> 5) | uVar7 & 0x3e0f83e0 | 0x1f07c1f;
      *pbVar9 = RGB32k.All[uVar7 >> 0xf & uVar7];
      pbVar9 = pbVar9 + iVar5 * lVar6;
      iVar4 = iVar4 + -1;
    } while (iVar4 != 0);
  }
  return;
}

Assistant:

void FillColumnAddClampPalCommand::Execute(DrawerThread *thread)
	{
		int count;
		uint8_t *dest;

		count = _count;

		dest = _dest;
		uint32_t *bg2rgb;
		uint32_t fg;

		bg2rgb = _destblend;
		fg = _srccolor;
		int pitch = _pitch;

		count = thread->count_for_thread(_dest_y, count);
		if (count <= 0)
			return;

		dest = thread->dest_for_thread(_dest_y, pitch, dest);
		pitch *= thread->num_cores;

		do
		{
			uint32_t a = fg + bg2rgb[*dest];
			uint32_t b = a;

			a |= 0x01f07c1f;
			b &= 0x40100400;
			a &= 0x3fffffff;
			b = b - (b >> 5);
			a |= b;
			*dest = RGB32k.All[a & (a >> 15)];
			dest += pitch;
		} while (--count);
	}